

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O3

bool __thiscall
OpenMD::Component::findMoleculeStamp
          (Component *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          *molStamps)

{
  pointer pcVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  key_type local_40;
  
  pcVar1 = (this->Type).data_._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->Type).data_._M_string_length);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          ::find(&molStamps->_M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = &(molStamps->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    this->moleculeStamp_ = *(MoleculeStamp **)(cVar2._M_node + 2);
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var3;
}

Assistant:

bool Component::findMoleculeStamp(
      const std::map<std::string, MoleculeStamp*>& molStamps) {
    bool ret = false;
    std::map<std::string, MoleculeStamp*>::const_iterator i;
    i = molStamps.find(getType());
    if (i != molStamps.end()) {
      moleculeStamp_ = i->second;
      ret            = true;
    }
    return ret;
  }